

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perceptron.cpp
# Opt level: O0

void __thiscall
PyreNet::Perceptron::calculate
          (Perceptron *this,vector<double,_std::allocator<double>_> *input,Activation *activation)

{
  double dVar1;
  size_type sVar2;
  InvalidInputSize *this_00;
  const_reference pvVar3;
  reference pvVar4;
  double extraout_XMM0_Qa;
  int local_2c;
  double dStack_28;
  int i;
  double weightedSum;
  Activation *activation_local;
  vector<double,_std::allocator<double>_> *input_local;
  Perceptron *this_local;
  
  sVar2 = std::vector<double,_std::allocator<double>_>::size(input);
  if (sVar2 != (long)this->inputSize) {
    this_00 = (InvalidInputSize *)__cxa_allocate_exception(8);
    memset(this_00,0,8);
    InvalidInputSize::InvalidInputSize(this_00);
    __cxa_throw(this_00,&InvalidInputSize::typeinfo,InvalidInputSize::~InvalidInputSize);
  }
  dStack_28 = 0.0;
  for (local_2c = 0; local_2c < this->inputSize; local_2c = local_2c + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](input,(long)local_2c);
    dVar1 = *pvVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->weights,(long)local_2c)
    ;
    dStack_28 = dVar1 * *pvVar4 + dStack_28;
  }
  pvVar4 = std::vector<double,_std::allocator<double>_>::back(&this->weights);
  (**activation->_vptr_Activation)(*pvVar4 + dStack_28);
  this->cachedValue = extraout_XMM0_Qa;
  return;
}

Assistant:

void Perceptron::calculate(const std::vector<double> &input, Activation *activation) {
        if (input.size() != this->inputSize) {
            throw InvalidInputSize();
        }
        double weightedSum = 0;
        for (int i = 0; i < this->inputSize; i++) {
            weightedSum += input[i] * this->weights[i];
        }
        weightedSum += 1 * this->weights.back(); // bias term
        this->cachedValue = activation->activate(weightedSum);
    }